

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O0

QByteArray * QTlsPrivate::X509CertificateBase::subjectInfoToString(SubjectInfo info)

{
  undefined4 in_ESI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *str;
  QByteArray *this;
  QByteArray local_e0;
  QByteArray local_c8;
  QByteArray local_b0;
  QByteArray local_98;
  QByteArray local_80;
  QByteArray local_68;
  QByteArray local_50;
  QByteArray local_38;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x104d33);
  switch(in_ESI) {
  case 0:
    QByteArray::QByteArray(&local_20,"O",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104d95);
    break;
  case 1:
    QByteArray::QByteArray(&local_38,"CN",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104dd3);
    break;
  case 2:
    QByteArray::QByteArray(&local_50,"L",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104e11);
    break;
  case 3:
    QByteArray::QByteArray(&local_68,"OU",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104e4f);
    break;
  case 4:
    QByteArray::QByteArray(&local_80,"C",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104e8d);
    break;
  case 5:
    QByteArray::QByteArray(&local_98,"ST",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104ec2);
    break;
  case 6:
    QByteArray::QByteArray(&local_b0,"dnQualifier",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104ef7);
    break;
  case 7:
    QByteArray::QByteArray(&local_c8,"serialNumber",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104f29);
    break;
  case 8:
    QByteArray::QByteArray(&local_e0,"emailAddress",-1);
    QByteArray::operator=(this,in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x104f5b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray X509CertificateBase::subjectInfoToString(QSslCertificate::SubjectInfo info)
{
    QByteArray str;
    switch (info) {
    case QSslCertificate::Organization: str = QByteArray("O"); break;
    case QSslCertificate::CommonName: str = QByteArray("CN"); break;
    case QSslCertificate::LocalityName: str = QByteArray("L"); break;
    case QSslCertificate::OrganizationalUnitName: str = QByteArray("OU"); break;
    case QSslCertificate::CountryName: str = QByteArray("C"); break;
    case QSslCertificate::StateOrProvinceName: str = QByteArray("ST"); break;
    case QSslCertificate::DistinguishedNameQualifier: str = QByteArray("dnQualifier"); break;
    case QSslCertificate::SerialNumber: str = QByteArray("serialNumber"); break;
    case QSslCertificate::EmailAddress: str = QByteArray("emailAddress"); break;
    }

    return str;
}